

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

int xmlSchematronRegisterVariables
              (xmlSchematronValidCtxtPtr vctxt,xmlXPathContextPtr_conflict ctxt,
              xmlSchematronLetPtr_conflict let,xmlDocPtr instance,xmlNodePtr cur)

{
  int iVar1;
  xmlXPathObjectPtr value;
  xmlXPathObjectPtr let_eval;
  xmlNodePtr cur_local;
  xmlDocPtr instance_local;
  xmlSchematronLetPtr_conflict let_local;
  xmlXPathContextPtr_conflict ctxt_local;
  xmlSchematronValidCtxtPtr vctxt_local;
  
  ctxt->doc = instance;
  ctxt->node = cur;
  instance_local = (xmlDocPtr)let;
  while( true ) {
    if (instance_local == (xmlDocPtr)0x0) {
      return 0;
    }
    value = xmlXPathCompiledEval((xmlXPathCompExprPtr)instance_local->name,ctxt);
    if (value == (xmlXPathObjectPtr)0x0) break;
    iVar1 = xmlXPathRegisterVariableNS(ctxt,*(xmlChar **)&instance_local->type,(xmlChar *)0x0,value)
    ;
    if (iVar1 != 0) {
      xmlSchematronVErr(vctxt,1,"Registering a let variable failed\n",(xmlChar *)0x0);
      return -1;
    }
    instance_local = (xmlDocPtr)instance_local->_private;
  }
  xmlSchematronVErr(vctxt,1,"Evaluation of compiled expression failed\n",(xmlChar *)0x0);
  return -1;
}

Assistant:

static int
xmlSchematronRegisterVariables(xmlSchematronValidCtxtPtr vctxt,
                               xmlXPathContextPtr ctxt,
                               xmlSchematronLetPtr let,
                               xmlDocPtr instance, xmlNodePtr cur)
{
    xmlXPathObjectPtr let_eval;

    ctxt->doc = instance;
    ctxt->node = cur;
    while (let != NULL) {
        let_eval = xmlXPathCompiledEval(let->comp, ctxt);
        if (let_eval == NULL) {
            xmlSchematronVErr(vctxt, XML_ERR_INTERNAL_ERROR,
                              "Evaluation of compiled expression failed\n",
                              NULL);
            return -1;
        }
        if(xmlXPathRegisterVariableNS(ctxt, let->name, NULL, let_eval)) {
            xmlSchematronVErr(vctxt, XML_ERR_INTERNAL_ERROR,
                              "Registering a let variable failed\n", NULL);
            return -1;
        }
        let = let->next;
    }
    return 0;
}